

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_ieee754_tan(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  operand local_ac;
  operand local_a8 [2];
  uint64_t header;
  operand local_7c;
  string error;
  string save_flonum;
  string is_fixnum;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  label_to_string_abi_cxx11_(&is_fixnum,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&save_flonum,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_((string *)&header,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&error,(string *)&header);
    std::__cxx11::string::~string((string *)&header);
    header = CONCAT44(header._4_4_,5);
    local_ac = R11;
    local_a8[0] = NUMBER;
    local_a8[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&header,&local_ac,local_a8,(int *)(local_a8 + 1));
    header = CONCAT44(header._4_4_,0x3d);
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&header,&error);
  }
  header = CONCAT44(header._4_4_,0x5a);
  local_ac = RCX;
  local_a8[0] = NUMBER;
  local_a8[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&header,&local_ac,local_a8,(int *)(local_a8 + 1));
  header = CONCAT44(header._4_4_,0x38);
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&header,&is_fixnum);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_is_not_block(code,RCX,R11,&error);
  }
  local_ac = AH;
  local_a8[0] = RCX;
  local_a8[1] = 0x39;
  header = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_ac,local_a8,local_a8 + 1,&header);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RCX,R11,&error);
  }
  header = CONCAT44(header._4_4_,0x16);
  local_ac = MEM_RCX;
  local_a8[0] = DH;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,(operation *)&header,&local_ac,(int *)local_a8);
  header = CONCAT44(header._4_4_,0x35);
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&header,&save_flonum);
  header = CONCAT44(header._4_4_,0x3e);
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&header,&is_fixnum);
  header = CONCAT44(header._4_4_,0x4e);
  local_ac = RCX;
  local_a8[0] = NUMBER;
  local_a8[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&header,&local_ac,local_a8,(int *)(local_a8 + 1));
  header = CONCAT44(header._4_4_,0x4b);
  local_ac = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&header,&local_ac);
  header = CONCAT44(header._4_4_,0x14);
  local_ac = MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&header,&local_ac);
  header = CONCAT44(header._4_4_,0x4a);
  local_ac = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&header,&local_ac);
  header = CONCAT44(header._4_4_,0x3e);
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&header,&save_flonum);
  header = 0x100000000000001;
  local_ac = ST6;
  local_a8[0] = R11;
  local_a8[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_ac,local_a8,local_a8 + 1);
  local_ac = XMM6;
  local_a8[0] = R11;
  local_a8[1] = 0x39;
  local_7c = CL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ac,local_a8,local_a8 + 1,(int *)&local_7c);
  local_ac = ST6;
  local_a8[0] = RAX;
  local_a8[1] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_ac,local_a8,local_a8 + 1,&header);
  local_ac = ST6;
  local_a8[0] = MEM_RBP;
  local_a8[1] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_ac,local_a8,local_a8 + 1);
  local_ac = MEM_RSI;
  assembler::asmcode::add<assembler::asmcode::operation>(code,&local_ac);
  local_ac = MEM_R9;
  local_a8[0] = ST0;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_ac,local_a8);
  local_ac = MEM_R9;
  local_a8[0] = MEM_RBP;
  local_a8[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,&local_ac,local_a8,(int *)(local_a8 + 1));
  local_ac = EMPTY;
  local_a8[0] = RBP;
  local_a8[1] = 0x39;
  local_7c = local_a8[0];
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_ac,local_a8,local_a8 + 1,(int *)&local_7c);
  local_ac = ST6;
  local_a8[0] = RAX;
  local_a8[1] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_ac,local_a8,local_a8 + 1);
  local_ac = BYTE_MEM_RDX;
  local_a8[0] = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_ac,local_a8);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_ieee754_tan_contract_violation);
  }
  std::__cxx11::string::~string((string *)&save_flonum);
  std::__cxx11::string::~string((string *)&is_fixnum);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_ieee754_tan(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string is_fixnum = label_to_string(label++);
  std::string save_flonum = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, is_fixnum);
  if (ops.safe_primitives)
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);

  code.add(asmcode::FLD, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::JMPS, save_flonum);
  code.add(asmcode::LABEL, is_fixnum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::FILD, asmcode::MEM_RSP);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::LABEL, save_flonum);

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(asmcode::MOV, asmcode::R11, ALLOC);
  code.add(asmcode::OR, asmcode::R11, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::FPTAN);
  code.add(asmcode::FSTP, asmcode::ST0);
  code.add(asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_ieee754_tan_contract_violation);
    }
  }